

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::Logger::resolveLoggerFormatSpec(Logger *this)

{
  EnumType lIndex;
  EnumType local_2c;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = &local_2c;
  local_2c = 2;
  local_10 = base::utils::std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/base/easylogging++.cc:635:38)>
             ::_M_invoke;
  local_18 = base::utils::std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/base/easylogging++.cc:635:38)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  LevelHelper::forEachLevel((EnumType *)local_28._8_8_,(function<bool_()> *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void Logger::resolveLoggerFormatSpec(void) const {
  base::type::EnumType lIndex = LevelHelper::kMinValid;
  LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
    base::LogFormat* logFormat =
    const_cast<base::LogFormat*>(&m_typedConfigurations->logFormat(LevelHelper::castFromInt(lIndex)));
    base::utils::Str::replaceFirstWithEscape(logFormat->m_format, base::consts::kLoggerIdFormatSpecifier, m_id);
    return false;
  });
}